

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::_InternalSerialize
          (VisionFeaturePrint *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int size;
  VisionFeaturePrint_Scene *value;
  uint8_t *puVar2;
  VisionFeaturePrint_Objects *value_00;
  void *data;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  VisionFeaturePrint *this_local;
  
  bVar1 = _internal_has_scene(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = _Internal::scene(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>
                             (0x14,value,puVar2,stream);
  }
  bVar1 = _internal_has_objects(this);
  if (bVar1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _Internal::objects(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>
                             (0x15,value_00,puVar2,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* VisionFeaturePrint::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
  if (_internal_has_scene()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        20, _Internal::scene(this), target, stream);
  }

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
  if (_internal_has_objects()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        21, _Internal::objects(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  return target;
}